

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O2

int mapBiomeEdge(Layer *l,int *out,int x,int z,int w,int h)

{
  int v01;
  int id;
  int v10;
  int v21;
  int v12;
  int mc;
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int idx;
  long lVar6;
  int *local_a0;
  int *local_78;
  int *local_70;
  int *local_68;
  
  mc = (int)l->mc;
  iVar1 = (*l->p->getMap)(l->p,out,x + -1,z + -1,w + 2,h + 2);
  if (iVar1 == 0) {
    lVar3 = (long)w;
    lVar5 = 0;
    if (0 < lVar3) {
      lVar5 = lVar3;
    }
    if (h < 1) {
      h = 0;
    }
    local_68 = out + lVar3 + 4;
    local_70 = out + lVar3 * 2 + 5;
    iVar1 = 0;
    uVar4 = 0;
    local_a0 = out;
    local_78 = out;
    while (uVar4 != (uint)h) {
      uVar4 = uVar4 + 1;
      for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
        v01 = local_68[lVar6 + -2];
        id = local_68[lVar6 + -1];
        v10 = local_78[lVar6 + 1];
        v21 = local_68[lVar6];
        v12 = local_70[lVar6];
        idx = iVar1 + (int)lVar6;
        iVar2 = replaceEdge(out,idx,mc,v10,v21,v01,v12,id,0x26,0x25);
        if (iVar2 == 0) {
          iVar2 = replaceEdge(out,idx,mc,v10,v21,v01,v12,id,0x27,0x25);
          if (iVar2 == 0) {
            iVar2 = replaceEdge(out,idx,mc,v10,v21,v01,v12,id,0x20,5);
            if (iVar2 == 0) {
              if (id == 6) {
                if (((((v10 == 2) || (v21 == 2)) || (v01 == 2)) ||
                    (((v12 == 2 || (v10 == 0x1e)) ||
                     ((v21 == 0x1e || ((v01 == 0x1e || (v12 == 0x1e)))))))) ||
                   ((v10 == 0xc || (((v21 == 0xc || (v01 == 0xc)) || (v12 == 0xc)))))) {
                  local_a0[lVar6] = 1;
                }
                else if ((((v10 == 0x15) || (v21 == 0x15)) ||
                         (((v01 == 0x15 || ((v12 == 0x15 || (v10 == 0xa8)))) || (v21 == 0xa8)))) ||
                        ((v01 == 0xa8 || (v12 == 0xa8)))) {
                  local_a0[lVar6] = 0x17;
                }
                else {
                  local_a0[lVar6] = 6;
                }
              }
              else if (id == 2) {
                if ((((v10 == 0xc) || (v21 == 0xc)) || (v01 == 0xc)) || (v12 == 0xc)) {
                  local_a0[lVar6] = 0x22;
                }
                else {
                  local_a0[lVar6] = 2;
                }
              }
              else {
                local_a0[lVar6] = id;
              }
            }
          }
        }
      }
      local_68 = local_68 + lVar3 + 2;
      local_70 = local_70 + lVar3 + 2;
      local_78 = local_78 + lVar3 + 2;
      local_a0 = local_a0 + lVar3;
      iVar1 = iVar1 + w;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mapBiomeEdge(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;
    int mc = l->mc;

    int err = l->p->getMap(l->p, out, pX, pZ, pW, pH);
    if unlikely(err != 0)
        return err;

    for (j = 0; j < h; j++)
    {
        int *vz0 = out + (j+0)*pW;
        int *vz1 = out + (j+1)*pW;
        int *vz2 = out + (j+2)*pW;

        for (i = 0; i < w; i++)
        {
            int v11 = vz1[i+1];
            int v10 = vz0[i+1];
            int v21 = vz1[i+2];
            int v01 = vz1[i+0];
            int v12 = vz2[i+1];

            if (!replaceEdge(out, i + j*w, mc, v10, v21, v01, v12, v11, wooded_badlands_plateau, badlands) &&
                !replaceEdge(out, i + j*w, mc, v10, v21, v01, v12, v11, badlands_plateau, badlands) &&
                !replaceEdge(out, i + j*w, mc, v10, v21, v01, v12, v11, giant_tree_taiga, taiga))
            {
                if (v11 == desert)
                {
                    if (!isAny4(snowy_tundra, v10, v21, v01, v12))
                    {
                        out[i + j*w] = v11;
                    }
                    else
                    {
                        out[i + j*w] = wooded_mountains;
                    }
                }
                else if (v11 == swamp)
                {
                    if (!isAny4(desert, v10, v21, v01, v12) &&
                        !isAny4(snowy_taiga, v10, v21, v01, v12) &&
                        !isAny4(snowy_tundra, v10, v21, v01, v12))
                    {
                        if (!isAny4(jungle, v10, v21, v01, v12) &&
                            !isAny4(bamboo_jungle, v10, v21, v01, v12))
                            out[i + j*w] = v11;
                        else
                            out[i + j*w] = jungle_edge;
                    }
                    else
                    {
                        out[i + j*w] = plains;
                    }
                }
                else
                {
                    out[i + j*w] = v11;
                }
            }
        }
    }

    return 0;
}